

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

parasail_matrix_t * parasail_matrix_copy(parasail_matrix_t *matrix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *__s;
  parasail_matrix_t *ppVar4;
  int *__dest;
  int *__dest_00;
  char *__dest_01;
  char *__dest_02;
  ulong uVar5;
  size_t sVar6;
  size_t __size;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_matrix_copy_cold_3();
  }
  else {
    ppVar4 = (parasail_matrix_t *)malloc(0x48);
    if (ppVar4 == (parasail_matrix_t *)0x0) {
      parasail_matrix_copy_cold_2();
    }
    else {
      ppVar4->name = matrix->name;
      iVar1 = matrix->size;
      ppVar4->size = iVar1;
      ppVar4->max = matrix->max;
      ppVar4->min = matrix->min;
      iVar2 = matrix->type;
      ppVar4->type = iVar2;
      iVar3 = matrix->length;
      ppVar4->length = iVar3;
      if (iVar2 == 1) {
        uVar5 = (ulong)(iVar3 * iVar1);
      }
      else if (iVar2 == 0) {
        uVar5 = (ulong)(uint)(iVar1 * iVar1);
      }
      else {
        uVar5 = 0;
      }
      __dest = (int *)malloc(0x400);
      if (__dest != (int *)0x0) {
        memcpy(__dest,matrix->mapper,0x400);
        sVar6 = uVar5 << 2;
        __dest_00 = (int *)malloc(sVar6);
        __size = sVar6;
        if (__dest_00 != (int *)0x0) {
          __size = (long)iVar1 + 1;
          memcpy(__dest_00,matrix->matrix,sVar6);
          __dest_01 = (char *)malloc(__size);
          if (__dest_01 != (char *)0x0) {
            memcpy(__dest_01,matrix->alphabet,__size);
            __s = matrix->query;
            if (__s == (char *)0x0) {
              __dest_02 = (char *)0x0;
            }
            else {
              sVar6 = strlen(__s);
              __size = sVar6 + 1;
              __dest_02 = (char *)malloc(__size);
              if (__dest_02 == (char *)0x0) goto LAB_004b3625;
              memcpy(__dest_02,__s,__size);
              __dest_02[sVar6] = '\0';
            }
            ppVar4->mapper = __dest;
            ppVar4->matrix = __dest_00;
            ppVar4->user_matrix = __dest_00;
            ppVar4->alphabet = __dest_01;
            ppVar4->query = __dest_02;
            return ppVar4;
          }
        }
LAB_004b3625:
        fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_matrix_copy",__size);
        return (parasail_matrix_t *)0x0;
      }
      parasail_matrix_copy_cold_1();
    }
  }
  return (parasail_matrix_t *)0x0;
}

Assistant:

parasail_matrix_t* parasail_matrix_copy(const parasail_matrix_t *matrix)
{
    parasail_matrix_t *retval = NULL;

    PARASAIL_CHECK_NULL(matrix);

    PARASAIL_NEW(retval, parasail_matrix_t);
    retval->name = matrix->name;
    retval->size = matrix->size;
    retval->max = matrix->max;
    retval->min = matrix->min;
    retval->type = matrix->type;
    retval->length = matrix->length;

    {
        size_t matrix_size = 0;
        size_t alphabet_size = (matrix->size+1);
        int *new_mapper = NULL;
        int *new_matrix = NULL;
        char *new_alphabet = NULL;
        char *new_query = NULL;

        if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
            matrix_size = matrix->size*matrix->size;
        }
        else if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
            matrix_size = matrix->size*matrix->length;
        }

        PARASAIL_CALLOC(new_mapper, int, 256);
        (void)memcpy(new_mapper, matrix->mapper, sizeof(int)*256);

        PARASAIL_CALLOC(new_matrix, int, matrix_size);
        (void)memcpy(new_matrix, matrix->matrix, sizeof(int)*matrix_size);

        PARASAIL_CALLOC(new_alphabet, char, alphabet_size);
        (void)memcpy(new_alphabet, matrix->alphabet, sizeof(char)*alphabet_size);

        if (matrix->query) {
            size_t query_size = strlen(matrix->query);
            PARASAIL_CALLOC(new_query, char, query_size+1);
            (void)memcpy(new_query, matrix->query, sizeof(char)*(query_size+1));
            new_query[query_size] = '\0';
        }

        retval->mapper = new_mapper;
        retval->matrix = new_matrix;
        retval->user_matrix = new_matrix;
        retval->alphabet = new_alphabet;
        retval->query = new_query;
    }

    return retval;
}